

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_swibuf::xr_swibuf(xr_swibuf *this,xr_swibuf *that)

{
  ulong uVar1;
  ogf4_slide_window *__src;
  ogf4_slide_window *__dest;
  
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = 0;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_swibuf_002487c8;
  uVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_size = uVar1;
  __src = that->m_slide_windows;
  if (__src == (ogf4_slide_window *)0x0) {
    __dest = (ogf4_slide_window *)0x0;
  }
  else {
    __dest = (ogf4_slide_window *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (uVar1 != 0) {
      memcpy(__dest,__src,uVar1 * 8);
    }
  }
  this->m_slide_windows = __dest;
  return;
}

Assistant:

xr_swibuf::xr_swibuf(const xr_swibuf& that)
{
	set_owner(true);
	set_size(that.size());
	m_slide_windows = duplicate(that.m_slide_windows);
}